

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::setDomainChangeStack
          (HighsDomain *this,
          vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgstack,
          vector<int,_std::allocator<int>_> *branchingPositions)

{
  int iVar1;
  HighsDomainChange boundchg;
  HighsDomainChange boundchg_00;
  HighsDomainChange boundchg_01;
  bool bVar2;
  pointer pHVar3;
  size_type sVar4;
  reference piVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  Reason this_00;
  undefined8 in_RDX;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *in_RSI;
  HighsDomain *in_RDI;
  HighsInt branchPos;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  HighsInt k;
  HighsInt stacksize;
  HighsDomainChange *domchg;
  iterator __end2;
  iterator __begin2;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *__range2;
  HighsDomain *in_stack_00000158;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *in_stack_fffffffffffffeb8;
  HighsDebugSol *this_01;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  *in_stack_fffffffffffffec0;
  vector<double,_std::allocator<double>_> *pvVar9;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *in_stack_fffffffffffffed0;
  HighsDomain *in_stack_ffffffffffffff58;
  Reason in_stack_ffffffffffffff60;
  Reason reason;
  double in_stack_ffffffffffffff68;
  double dVar10;
  Reason in_stack_ffffffffffffff70;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  undefined8 local_48;
  int local_40;
  int local_3c;
  reference local_38;
  HighsDomainChange *local_30;
  __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
  local_28;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_20;
  undefined8 local_18;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *local_10;
  
  in_RDI->infeasible_ = false;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x5c71d9);
  HighsDebugSol::resetDomain((HighsDebugSol *)&pHVar3->field_0x68b0,in_RDI);
  bVar2 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::empty
                    (in_stack_fffffffffffffed0);
  if (!bVar2) {
    local_20 = &in_RDI->domchgstack_;
    local_28._M_current =
         (HighsDomainChange *)
         std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::begin
                   (in_stack_fffffffffffffeb8);
    local_30 = (HighsDomainChange *)
               std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::end
                         (in_stack_fffffffffffffeb8);
    while (bVar2 = __gnu_cxx::operator!=
                             (in_stack_fffffffffffffec0,
                              (__normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                               *)in_stack_fffffffffffffeb8), bVar2) {
      local_38 = __gnu_cxx::
                 __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
                 ::operator*(&local_28);
      if (local_38->boundtype == kLower) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->colLowerPos_,(long)local_38->column);
        *pvVar6 = -1;
      }
      else {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->colUpperPos_,(long)local_38->column);
        *pvVar6 = -1;
      }
      __gnu_cxx::
      __normal_iterator<HighsDomainChange_*,_std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>_>
      ::operator++(&local_28);
    }
  }
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::clear
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)0x5c72fd);
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::clear
            ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)0x5c730e);
  std::vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>::clear
            ((vector<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_> *)0x5c731f);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x5c7333);
  sVar4 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size(local_10);
  local_3c = (int)sVar4;
  local_40 = 0;
  local_48 = local_18;
  local_50._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb8);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffec0,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffeb8), bVar2) {
    piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&local_50);
    iVar1 = *piVar5;
    for (; local_40 < iVar1; local_40 = local_40 + 1) {
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_40);
      if (pvVar7->boundtype == kLower) {
        pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_10,(long)local_40);
        dVar10 = pvVar7->boundval;
        pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_10,(long)local_40);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->col_lower_,(long)pvVar7->column);
        if (*pvVar8 < dVar10) goto LAB_005c7468;
      }
      else {
LAB_005c7468:
        pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_10,(long)local_40);
        if (pvVar7->boundtype == kUpper) {
          pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                             (local_10,(long)local_40);
          dVar10 = pvVar7->boundval;
          pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                             (local_10,(long)local_40);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->col_upper_,(long)pvVar7->column);
          if (*pvVar8 <= dVar10) goto LAB_005c7587;
        }
        std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                  (local_10,(long)local_40);
        Reason::unspecified();
        boundchg.column = in_stack_ffffffffffffff70.type;
        boundchg.boundtype = in_stack_ffffffffffffff70.index;
        boundchg.boundval = in_stack_ffffffffffffff68;
        changeBound(in_stack_ffffffffffffff58,boundchg,in_stack_ffffffffffffff60);
        if ((in_RDI->infeasible_ & 1U) == 0) {
          propagate(in_stack_00000158);
        }
        if ((in_RDI->infeasible_ & 1U) != 0) {
          return;
        }
      }
LAB_005c7587:
    }
    if (local_40 == local_3c) {
      return;
    }
    pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (local_10,(long)local_40);
    if (pvVar7->boundtype == kLower) {
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_40);
      dVar10 = pvVar7->boundval;
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_40);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->col_lower_,(long)pvVar7->column);
      if (*pvVar8 < dVar10) goto LAB_005c7806;
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_40);
      dVar10 = pvVar7->boundval;
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_40);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->col_lower_,(long)pvVar7->column);
      if (*pvVar8 <= dVar10) {
        pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_10,(long)local_40);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->colLowerPos_,(long)pvVar7->column);
        iVar1 = *pvVar6;
joined_r0x005c77fb:
        if (iVar1 == -1) goto LAB_005c7806;
      }
    }
    else {
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_40);
      dVar10 = pvVar7->boundval;
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_40);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->col_upper_,(long)pvVar7->column);
      if (*pvVar8 <= dVar10) {
        pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_10,(long)local_40);
        dVar10 = pvVar7->boundval;
        pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_10,(long)local_40);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->col_upper_,(long)pvVar7->column);
        if (dVar10 < *pvVar8 || dVar10 == *pvVar8) {
          pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                             (local_10,(long)local_40);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->colUpperPos_,(long)pvVar7->column);
          iVar1 = *pvVar6;
          goto joined_r0x005c77fb;
        }
        goto LAB_005c789b;
      }
LAB_005c7806:
      std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                (local_10,(long)local_40);
      in_stack_ffffffffffffff70 = Reason::branching();
      boundchg_00.column = in_stack_ffffffffffffff70.type;
      boundchg_00.boundtype = in_stack_ffffffffffffff70.index;
      boundchg_00.boundval = in_stack_ffffffffffffff68;
      changeBound(in_stack_ffffffffffffff58,boundchg_00,in_stack_ffffffffffffff60);
      if ((in_RDI->infeasible_ & 1U) == 0) {
        propagate(in_stack_00000158);
      }
      if ((in_RDI->infeasible_ & 1U) != 0) {
        return;
      }
    }
LAB_005c789b:
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_50);
  }
  do {
    if (local_3c <= local_40) {
      return;
    }
    pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                       (local_10,(long)local_40);
    if (pvVar7->boundtype == kLower) {
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_40);
      dVar10 = pvVar7->boundval;
      pvVar9 = &in_RDI->col_lower_;
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_40);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](pvVar9,(long)pvVar7->column)
      ;
      if (*pvVar8 < dVar10) goto LAB_005c794b;
    }
    else {
LAB_005c794b:
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_40);
      if (pvVar7->boundtype == kUpper) {
        pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_10,(long)local_40);
        dVar10 = pvVar7->boundval;
        pvVar9 = &in_RDI->col_upper_;
        pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           (local_10,(long)local_40);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           (pvVar9,(long)pvVar7->column);
        if (*pvVar8 <= dVar10) goto LAB_005c7ab4;
      }
      pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x5c79ea);
      this_01 = (HighsDebugSol *)&pHVar3->field_0x68b0;
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_40);
      HighsDebugSol::boundChangeAdded(this_01,in_RDI,pvVar7,true);
      pvVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                         (local_10,(long)local_40);
      reason = (Reason)pvVar7->boundval;
      dVar10 = *(double *)&pvVar7->column;
      this_00 = Reason::unspecified();
      boundchg_01.column = in_stack_ffffffffffffff70.type;
      boundchg_01.boundtype = in_stack_ffffffffffffff70.index;
      boundchg_01.boundval = dVar10;
      changeBound((HighsDomain *)this_00,boundchg_01,reason);
      if ((in_RDI->infeasible_ & 1U) == 0) {
        propagate(in_stack_00000158);
      }
      if ((in_RDI->infeasible_ & 1U) != 0) {
        return;
      }
    }
LAB_005c7ab4:
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void HighsDomain::setDomainChangeStack(
    const std::vector<HighsDomainChange>& domchgstack,
    const std::vector<HighsInt>& branchingPositions) {
  infeasible_ = false;
  mipsolver->mipdata_->debugSolution.resetDomain(*this);

  if (!domchgstack_.empty()) {
    for (const HighsDomainChange& domchg : domchgstack_) {
      if (domchg.boundtype == HighsBoundType::kLower)
        colLowerPos_[domchg.column] = -1;
      else
        colUpperPos_[domchg.column] = -1;
    }
  }

  prevboundval_.clear();
  domchgstack_.clear();
  domchgreason_.clear();
  branchPos_.clear();
  HighsInt stacksize = domchgstack.size();
  HighsInt k = 0;
  for (HighsInt branchPos : branchingPositions) {
    for (; k < branchPos; ++k) {
      if (domchgstack[k].boundtype == HighsBoundType::kLower &&
          domchgstack[k].boundval <= col_lower_[domchgstack[k].column])
        continue;
      if (domchgstack[k].boundtype == HighsBoundType::kUpper &&
          domchgstack[k].boundval >= col_upper_[domchgstack[k].column])
        continue;

      changeBound(domchgstack[k], Reason::unspecified());
      if (!infeasible_) propagate();
      if (infeasible_) return;
    }

    if (k == stacksize) return;

    // For redundant branching bound changes we need to be more careful due to
    // symmetry handling. If these bound changes are redundant simply because
    // the corresponding subtree was enumerated and hence the global bound
    // updated, then we still need to keep their status as branching variables
    // for computing correct stabilizers. They can, however, be safely dropped
    // if they are either strictly redundant in the global domain, or if there
    // is already a local bound change that makes the branching change
    // redundant.
    if (domchgstack[k].boundtype == HighsBoundType::kLower) {
      if (domchgstack[k].boundval <= col_lower_[domchgstack[k].column]) {
        if (domchgstack[k].boundval < col_lower_[domchgstack[k].column])
          continue;
        if (colLowerPos_[domchgstack[k].column] != -1) continue;
      }
    } else {
      if (domchgstack[k].boundval >= col_upper_[domchgstack[k].column]) {
        if (domchgstack[k].boundval > col_upper_[domchgstack[k].column])
          continue;
        if (colUpperPos_[domchgstack[k].column] != -1) continue;
      }
    }

    changeBound(domchgstack[k], Reason::branching());
    if (!infeasible_) propagate();
    if (infeasible_) return;
  }

  for (; k < stacksize; ++k) {
    if (domchgstack[k].boundtype == HighsBoundType::kLower &&
        domchgstack[k].boundval <= col_lower_[domchgstack[k].column])
      continue;
    if (domchgstack[k].boundtype == HighsBoundType::kUpper &&
        domchgstack[k].boundval >= col_upper_[domchgstack[k].column])
      continue;

    mipsolver->mipdata_->debugSolution.boundChangeAdded(*this, domchgstack[k],
                                                        true);

    changeBound(domchgstack[k], Reason::unspecified());
    if (!infeasible_) propagate();
    if (infeasible_) break;
  }
}